

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-math.h
# Opt level: O1

shared_ptr<RoomBase> RoomMath::getMathAddBR(element_type *param_1)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined1 auVar2 [16];
  double dVar3;
  shared_ptr<RoomBase> sVar4;
  shared_ptr<RoomMath> result;
  anon_class_1_0_00000001 local_29;
  RoomMath *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (RoomMath *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<RoomMath,std::allocator<RoomMath>>
            (a_Stack_20,&local_28,(allocator<RoomMath> *)&local_29);
  (local_28->super_RoomBase).mode = BattleRoyale;
  std::__cxx11::string::_M_replace
            ((ulong)&(local_28->super_RoomBase).name,0,
             (char *)(local_28->super_RoomBase).name._M_string_length,0x10e65e);
  (local_28->super_RoomBase).poolSize = 0x1e;
  if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
    getMathAddBR();
  }
  lVar1 = std::chrono::_V2::steady_clock::now();
  lVar1 = lVar1 / 1000000 - anon_unknown.dwarf_113e3::timestamp_s::tStart;
  auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar2._0_8_ = lVar1;
  auVar2._12_4_ = 0x45300000;
  dVar3 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 0.001;
  (local_28->super_RoomBase).tCreated_s = dVar3;
  (local_28->super_RoomBase).tRoundLength_s = 15.0;
  (local_28->super_RoomBase).tBRRoundLength_s = 15.0;
  (local_28->super_RoomBase).tRoundStart_s = dVar3 + -15.0;
  std::function<std::pair<std::__cxx11::string,std::__cxx11::string>(int,int)>::operator=
            ((function<std::pair<std::__cxx11::string,std::__cxx11::string>(int,int)> *)
             &local_28->getQuery,&local_29);
  param_1->id = 0;
  param_1->mode = Standard;
  param_1->_vptr_RoomBase = (_func_int **)local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&param_1->id = a_Stack_20[0]._M_pi;
  sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = param_1;
  return (shared_ptr<RoomBase>)sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getMathAddBR(Parameters parameters) {
        auto result = std::make_shared<RoomMath>();

        result->mode = BattleRoyale;
        result->name = "Math [+,BR]";
        result->poolSize = 30;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 0.25f*60.f;
        result->tBRRoundLength_s = 0.25f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        result->getQuery = [](int a, int b) -> std::pair<std::string, std::string> {
            return {
                std::to_string(a) + "+" + std::to_string(b),
                std::to_string(a+b),
            };
        };

        return result;
    }